

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
yy::mylanguage_parser::basic_symbol<yy::mylanguage_parser::by_kind>::clear
          (basic_symbol<yy::mylanguage_parser::by_kind> *this)

{
  symbol_kind_type sVar1;
  
  sVar1 = (this->super_by_kind).kind_;
  if (((uint)(sVar1 + ~S_CONSTANT) < 2) || (sVar1 == S_IDENTIFIER)) {
    value_type::destroy<std::__cxx11::string>(&this->value);
  }
  else if (sVar1 == S_CONSTANT) {
    value_type::destroy<double>(&this->value);
  }
  (this->super_by_kind).kind_ = S_YYEMPTY;
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_CONSTANT: // CONSTANT
        value.template destroy< double > ();
        break;

      case symbol_kind::S_IDENTIFIER: // IDENTIFIER
      case symbol_kind::S_STRING_LITERAL: // STRING_LITERAL
      case symbol_kind::S_NAKED_ARG: // NAKED_ARG
        value.template destroy< std::string > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }